

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sVar4;
  string *psVar5;
  int cached_size;
  int n;
  int i;
  int cached_size_2;
  size_t data_size_1;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  SourceCodeInfo_Location *this_local;
  
  data_size = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SourceCodeInfo_Location::unknown_fields(this);
    data_size = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  sVar3 = internal::WireFormatLite::Int32Size(&this->path_);
  if (sVar3 != 0) {
    sVar4 = internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1 + data_size;
  }
  iVar2 = internal::ToCachedSize(sVar3);
  this->_path_cached_byte_size_ = iVar2;
  data_size = sVar3 + data_size;
  sVar3 = internal::WireFormatLite::Int32Size(&this->span_);
  if (sVar3 != 0) {
    sVar4 = internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1 + data_size;
  }
  iVar2 = internal::ToCachedSize(sVar3);
  this->_span_cached_byte_size_ = iVar2;
  iVar2 = leading_detached_comments_size(this);
  sVar4 = internal::FromIntSize(iVar2);
  data_size = sVar4 + sVar3 + data_size;
  cached_size = 0;
  iVar2 = leading_detached_comments_size(this);
  for (; cached_size < iVar2; cached_size = cached_size + 1) {
    psVar5 = leading_detached_comments_abi_cxx11_(this,cached_size);
    sVar3 = internal::WireFormatLite::StringSize(psVar5);
    data_size = sVar3 + data_size;
  }
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    bVar1 = has_leading_comments(this);
    if (bVar1) {
      psVar5 = leading_comments_abi_cxx11_(this);
      sVar3 = internal::WireFormatLite::StringSize(psVar5);
      data_size = sVar3 + 1 + data_size;
    }
    bVar1 = has_trailing_comments(this);
    if (bVar1) {
      psVar5 = trailing_comments_abi_cxx11_(this);
      sVar3 = internal::WireFormatLite::StringSize(psVar5);
      data_size = sVar3 + 1 + data_size;
    }
  }
  iVar2 = internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->leading_detached_comments_size());
  for (int i = 0, n = this->leading_detached_comments_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->leading_detached_comments(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}